

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>::
operator()(QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>
           *this,idx_t *input)

{
  MadAccessor<long,_long,_long> *this_00;
  RESULT_TYPE_conflict2 RVar1;
  RESULT_TYPE_conflict2 local_10;
  
  this_00 = this->outer;
  local_10 = QuantileIndirect<long>::operator()(this->inner,input);
  RVar1 = MadAccessor<long,_long,_long>::operator()(this_00,&local_10);
  return RVar1;
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}